

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

DirHandle * open_directory(char *name,char **errmsg)

{
  DIR *pDVar1;
  int *piVar2;
  char *pcVar3;
  DirHandle *ret;
  DIR *dir;
  char **errmsg_local;
  char *name_local;
  
  pDVar1 = opendir(name);
  if (pDVar1 == (DIR *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    *errmsg = pcVar3;
    name_local = (char *)0x0;
  }
  else {
    name_local = (char *)safemalloc(1,8,0);
    *(DIR **)name_local = pDVar1;
  }
  return (DirHandle *)name_local;
}

Assistant:

DirHandle *open_directory(const char *name, const char **errmsg)
{
    DIR *dir;
    DirHandle *ret;

    dir = opendir(name);
    if (!dir) {
        *errmsg = strerror(errno);
        return NULL;
    }

    ret = snew(DirHandle);
    ret->dir = dir;
    return ret;
}